

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O1

vector<boost::any,_std::allocator<boost::any>_> * __thiscall
Scine::Core::ModuleManager::Impl::getAll
          (vector<boost::any,_std::allocator<boost::any>_> *__return_storage_ptr__,Impl *this,
          string *interface,string *moduleName)

{
  pointer pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  int iVar5;
  pointer pLVar6;
  bool bVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  pointer pbVar9;
  pointer pLVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  string modulePtrLower;
  string moduleNameLower;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  pointer local_98;
  pointer local_90;
  long *local_88;
  long *local_80;
  pointer local_78;
  long local_70 [2];
  long *local_60;
  pointer local_58;
  long local_50 [2];
  pointer local_40;
  pointer local_38;
  
  (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<boost::any,_std::allocator<boost::any>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::locale::locale((locale *)local_d8);
  pcVar1 = (moduleName->_M_dataplus)._M_p;
  local_80 = local_70;
  std::__cxx11::string::
  _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
            ((string *)&local_80,pcVar1,(locale *)local_d8,pcVar1 + moduleName->_M_string_length,
             (locale *)local_d8);
  std::locale::~locale((locale *)local_d8);
  if ((moduleName->_M_string_length == 0) ||
     (iVar5 = std::__cxx11::string::compare((char *)&local_80), iVar5 == 0)) {
    pLVar6 = (this->_sources).
             super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98 = (this->_sources).
               super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar6 != local_98) {
      do {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (pLVar6->modules).
                 super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_90 = pLVar6;
        for (p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (pLVar6->modules).
                      super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; p_Var8 != p_Var3;
            p_Var8 = p_Var8 + 0x10) {
          (**(code **)(**(long **)p_Var8 + 0x30))(local_d8,*(long **)p_Var8,interface);
          uVar4 = local_d8._8_8_;
          for (pbVar9 = (pointer)local_d8._0_8_; pbVar9 != (pointer)uVar4; pbVar9 = pbVar9 + 1) {
            (**(code **)(**(long **)p_Var8 + 0x18))
                      ((any *)local_b8,*(long **)p_Var8,interface,pbVar9);
            std::vector<boost::any,_std::allocator<boost::any>_>::emplace_back<boost::any>
                      (__return_storage_ptr__,(any *)local_b8);
            if ((pointer)local_b8._0_8_ != (pointer)0x0) {
              (**(code **)(*(long *)local_b8._0_8_ + 8))();
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8);
        }
        pLVar6 = local_90 + 1;
      } while (pLVar6 != local_98);
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
  }
  else {
    pLVar6 = (this->_sources).
             super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->_sources).
               super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = true;
    if (pLVar6 != local_40) {
      bVar7 = false;
      do {
        pLVar10 = (pointer)(pLVar6->modules).
                           super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        local_90 = (pointer)(pLVar6->modules).
                            super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
        bVar11 = pLVar10 == local_90;
        local_38 = pLVar6;
        while (!(bool)bVar11) {
          local_98 = (pointer)CONCAT71(local_98._1_7_,bVar11);
          (**(code **)(*(long *)((__shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2> *)
                                &pLVar10->library)->_M_ptr + 0x10))(local_b8);
          std::locale::locale((locale *)&local_88);
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::
          _M_construct<boost::iterators::transform_iterator<boost::algorithm::detail::to_lowerF<char>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::use_default,boost::use_default>>
                    ((string *)local_d8,local_b8._0_8_,(locale *)&local_88,
                     (placeholder *)(local_b8._0_8_ + (long)(_Alloc_hider *)local_b8._8_8_),
                     (locale *)&local_88);
          std::locale::~locale((locale *)&local_88);
          if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_b8._16_8_)->_M_p + 1));
          }
          pbVar9 = local_78;
          bVar12 = true;
          if ((pointer)local_d8._8_8_ == local_78) {
            if ((pointer)local_d8._8_8_ == (pointer)0x0) {
              bVar12 = false;
            }
            else {
              iVar5 = bcmp((void *)local_d8._0_8_,local_80,local_d8._8_8_);
              bVar12 = iVar5 != 0;
            }
          }
          if (bVar12) {
            local_60 = local_50;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_60,local_80,
                       (undefined1 *)((long)&(pbVar9->_M_dataplus)._M_p + (long)local_80));
            std::__cxx11::string::append((char *)&local_60);
            bVar13 = true;
            if ((pointer)local_d8._8_8_ == local_58) {
              if ((pointer)local_d8._8_8_ == (pointer)0x0) {
                bVar13 = false;
              }
              else {
                iVar5 = bcmp((void *)local_d8._0_8_,local_60,local_d8._8_8_);
                bVar13 = iVar5 != 0;
              }
            }
          }
          else {
            bVar13 = false;
          }
          if ((bVar12) && (local_60 != local_50)) {
            operator_delete(local_60,local_50[0] + 1);
          }
          if (!bVar13) {
            peVar2 = ((__shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2> *)
                     &pLVar10->library)->_M_ptr;
            (**(code **)(*(long *)peVar2 + 0x30))(local_b8,peVar2,interface);
            uVar4 = local_b8._8_8_;
            for (pbVar9 = (pointer)local_b8._0_8_; pbVar9 != (pointer)uVar4; pbVar9 = pbVar9 + 1) {
              peVar2 = ((__shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2> *)
                       &pLVar10->library)->_M_ptr;
              (**(code **)(*(long *)peVar2 + 0x18))((locale *)&local_88,peVar2,interface,pbVar9);
              std::vector<boost::any,_std::allocator<boost::any>_>::emplace_back<boost::any>
                        (__return_storage_ptr__,(any *)&local_88);
              if (local_88 != (long *)0x0) {
                (**(code **)(*local_88 + 8))();
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b8);
            bVar7 = true;
            bVar13 = false;
          }
          if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_d8._16_8_)->_M_p + 1));
          }
          if (!bVar13) {
            bVar11 = (byte)local_98;
            break;
          }
          pLVar10 = (pointer)&(pLVar10->modules).
                              super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
          bVar11 = pLVar10 == local_90;
        }
        if ((bVar11 & 1) == 0) goto LAB_0010a057;
        pLVar6 = local_38 + 1;
      } while (pLVar6 != local_40);
      bVar7 = true;
    }
LAB_0010a057:
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    if (!bVar7) {
      std::vector<boost::any,_std::allocator<boost::any>_>::~vector(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<boost::any> getAll(const std::string& interface, const std::string& moduleName) const {
    std::vector<boost::any> models;

    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          for (const auto& model : modulePtr->announceModels(interface)) {
            models.push_back(modulePtr->get(interface, model));
          }

          return models;
        }
      }
      return models;
    }

    for (const auto& source : _sources) {
      for (const auto& modulePtr : source.modules) {
        for (const auto& model : modulePtr->announceModels(interface)) {
          models.push_back(modulePtr->get(interface, model));
        }
      }
    }

    return models;
  }